

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

void cpu_wrdsp_mips64el(uint32_t rs,uint32_t mask_num,CPUMIPSState_conflict5 *env)

{
  ulong uVar1;
  target_ulong dsp;
  uint32_t overwrite;
  uint32_t newbits;
  uint8_t i;
  uint8_t mask [6];
  CPUMIPSState_conflict5 *env_local;
  uint32_t mask_num_local;
  uint32_t rs_local;
  
  dsp._4_4_ = 0;
  dsp._0_4_ = 0xffffffff;
  uVar1 = (env->active_tc).DSPControl;
  for (overwrite._1_1_ = 0; overwrite._1_1_ < 6; overwrite._1_1_ = overwrite._1_1_ + 1) {
    *(byte *)((long)&overwrite + (ulong)overwrite._1_1_ + 2) =
         (byte)(mask_num >> (overwrite._1_1_ & 0x1f)) & 1;
  }
  if (overwrite._2_1_ == '\x01') {
    dsp._0_4_ = 0xffffff80;
    dsp._4_4_ = rs & 0x7f;
  }
  if (overwrite._3_1_ == '\x01') {
    dsp._0_4_ = (uint)dsp & 0xffffe07f;
    dsp._4_4_ = rs & 0x1f80 | dsp._4_4_;
  }
  if ((char)newbits == '\x01') {
    dsp._0_4_ = (uint)dsp & 0xffffdfff;
    dsp._4_4_ = rs & 0x2000 | dsp._4_4_;
  }
  if (newbits._1_1_ == '\x01') {
    dsp._0_4_ = (uint)dsp & 0xff00ffff;
    dsp._4_4_ = rs & 0xff0000 | dsp._4_4_;
  }
  if (newbits._2_1_ == '\x01') {
    dsp._0_4_ = (uint)dsp & 0xffffff;
    dsp._4_4_ = rs & 0xff000000 | dsp._4_4_;
  }
  if (newbits._3_1_ == '\x01') {
    dsp._0_4_ = (uint)dsp & 0xffffbfff;
    dsp._4_4_ = rs & 0x4000 | dsp._4_4_;
  }
  (env->active_tc).DSPControl = uVar1 & (uint)dsp | (ulong)dsp._4_4_;
  return;
}

Assistant:

void cpu_wrdsp(uint32_t rs, uint32_t mask_num, CPUMIPSState *env)
{
    uint8_t  mask[6];
    uint8_t  i;
    uint32_t newbits, overwrite;
    target_ulong dsp;

    newbits   = 0x00;
    overwrite = 0xFFFFFFFF;
    dsp = env->active_tc.DSPControl;

    for (i = 0; i < 6; i++) {
        mask[i] = (mask_num >> i) & 0x01;
    }

    if (mask[0] == 1) {
#if defined(TARGET_MIPS64)
        overwrite &= 0xFFFFFF80;
        newbits   &= 0xFFFFFF80;
        newbits   |= 0x0000007F & rs;
#else
        overwrite &= 0xFFFFFFC0;
        newbits   &= 0xFFFFFFC0;
        newbits   |= 0x0000003F & rs;
#endif
    }

    if (mask[1] == 1) {
        overwrite &= 0xFFFFE07F;
        newbits   &= 0xFFFFE07F;
        newbits   |= 0x00001F80 & rs;
    }

    if (mask[2] == 1) {
        overwrite &= 0xFFFFDFFF;
        newbits   &= 0xFFFFDFFF;
        newbits   |= 0x00002000 & rs;
    }

    if (mask[3] == 1) {
        overwrite &= 0xFF00FFFF;
        newbits   &= 0xFF00FFFF;
        newbits   |= 0x00FF0000 & rs;
    }

    if (mask[4] == 1) {
        overwrite &= 0x00FFFFFF;
        newbits   &= 0x00FFFFFF;
#if defined(TARGET_MIPS64)
        newbits   |= 0xFF000000 & rs;
#else
        newbits   |= 0x0F000000 & rs;
#endif
    }

    if (mask[5] == 1) {
        overwrite &= 0xFFFFBFFF;
        newbits   &= 0xFFFFBFFF;
        newbits   |= 0x00004000 & rs;
    }

    dsp = dsp & overwrite;
    dsp = dsp | newbits;
    env->active_tc.DSPControl = dsp;
}